

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O0

void anon_unknown.dwarf_4ab76::invertM44f(M44f *m,float e)

{
  bool bVar1;
  Matrix44<float> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined1 singExc;
  M44f ident2;
  M44f ident1;
  M44f inv2;
  M44f inv1;
  float in_stack_fffffffffffffefc;
  Matrix44<float> *in_stack_ffffffffffffff00;
  Matrix44<float> *in_stack_ffffffffffffff08;
  
  singExc = (undefined1)((uint)in_XMM0_Da >> 0x18);
  Imath_2_5::Matrix44<float>::inverse((Matrix44<float> *)ident2.x._12_8_,ident2.x[0][2]._3_1_);
  Imath_2_5::Matrix44<float>::gjInverse(in_RDI,(bool)singExc);
  Imath_2_5::Matrix44<float>::operator*(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Imath_2_5::Matrix44<float>::operator*(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (!bVar1) {
    __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                  ,0x3f,"void (anonymous namespace)::invertM44f(const M44f &, float)");
  }
  bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  if (!bVar1) {
    __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                  ,0x40,"void (anonymous namespace)::invertM44f(const M44f &, float)");
  }
  return;
}

Assistant:

void
invertM44f (const M44f &m, float e)
{
    M44f inv1 = m.inverse();
    M44f inv2 = m.gjInverse();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}